

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

bool Assimp::IFC::IsTrue(BOOLEAN *in)

{
  bool bVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pbVar3 = &(in->super_STRING).val;
  std::__cxx11::string::string((string *)&bStack_58,(string *)pbVar3);
  bVar1 = std::operator==(&bStack_58,"TRUE");
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_38,(string *)pbVar3);
    bVar2 = std::operator==(&local_38,"T");
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)&bStack_58);
  return bVar2;
}

Assistant:

bool IsTrue(const ::Assimp::STEP::EXPRESS::BOOLEAN& in)
{
    return (std::string)in == "TRUE" || (std::string)in == "T";
}